

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O2

void GraphTask::setup(search *sch,multi_ex *ec)

{
  uint uVar1;
  task_data *D;
  example *peVar2;
  pointer pvVar3;
  pointer puVar4;
  vw *pvVar5;
  uint32_t *puVar6;
  ulong uVar7;
  pointer puVar8;
  ostream *poVar9;
  vw_exception *pvVar10;
  pointer ppeVar11;
  uint64_t *puVar12;
  wclass *pwVar13;
  long lVar14;
  wclass *pwVar15;
  ulong uVar16;
  long lVar17;
  size_t n_1;
  size_t n;
  long lVar18;
  bool bVar19;
  allocator_type local_232;
  allocator_type local_231;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_230;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream __msg;
  ostream local_1a8;
  
  D = (task_data *)sch->task_data;
  D->multiplier = D->wpp << ((byte)D->ss & 0x3f);
  pvVar5 = Search::search::get_vw_pointer_unsafe(sch);
  D->wpp = (ulong)pvVar5->wpp;
  pvVar5 = Search::search::get_vw_pointer_unsafe(sch);
  puVar12 = &(pvVar5->weights).dense_weights._weight_mask;
  if ((pvVar5->weights).sparse != false) {
    puVar12 = &(pvVar5->weights).sparse_weights._weight_mask;
  }
  D->mask = *puVar12;
  pvVar5 = Search::search::get_vw_pointer_unsafe(sch);
  puVar6 = &(pvVar5->weights).dense_weights._stride_shift;
  if ((pvVar5->weights).sparse != false) {
    puVar6 = &(pvVar5->weights).sparse_weights._stride_shift;
  }
  D->ss = (ulong)*puVar6;
  D->N = 0;
  D->E = 0;
  for (uVar7 = 0;
      ppeVar11 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppeVar11 >> 3);
      uVar7 = uVar7 + 1) {
    peVar2 = ppeVar11[uVar7];
    if ((ulong)((long)(peVar2->l).cs.costs._end - (long)(peVar2->l).cs.costs._begin) < 0x11) {
      if (D->E != 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
        std::operator<<(&local_1a8,"error: got a node after getting edges!");
        pvVar10 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar10,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search_graph.cc"
                   ,0xcb,&local_1d8);
        __cxa_throw(pvVar10,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      D->N = D->N + 1;
      peVar2 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar7];
      pwVar13 = (peVar2->l).cs.costs._begin;
      if ((peVar2->l).cs.costs._end != pwVar13) {
        uVar1 = pwVar13->class_index;
        D->true_counts[uVar1] = D->true_counts[uVar1] + 1.0;
        D->true_counts_total = D->true_counts_total + 1.0;
      }
    }
    else {
      D->E = D->E + 1;
    }
  }
  uVar1 = D->N;
  if (((ulong)uVar1 == 0) && (D->E != 0)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    std::operator<<(&local_1a8,
                    "error: got edges without any nodes (perhaps ring_size is too small?)!");
    pvVar10 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar10,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search_graph.cc"
               ,0xd6,&local_1f8);
    __cxa_throw(pvVar10,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_230,0,&local_231);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)&__msg,(ulong)uVar1,(value_type *)&local_230,&local_232);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::_M_move_assign(&D->adj,&__msg);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)&__msg);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_230);
  puVar8 = (pointer)(ulong)D->N;
  ppeVar11 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  do {
    lVar14 = 4;
    local_230._M_impl.super__Vector_impl_data._M_start = puVar8;
    if ((pointer)((long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppeVar11 >> 3) <= puVar8) {
      run_bfs(D,ec);
      puVar8 = (D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar8) {
        (D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar8;
      }
      for (uVar7 = 0; uVar7 < D->N; uVar7 = uVar7 + 1) {
        ___msg = D->K + 1;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (&D->pred,(unsigned_long *)&__msg);
      }
      return;
    }
    pwVar13 = (ppeVar11[(long)puVar8]->l).cs.costs._begin;
    pwVar15 = (ppeVar11[(long)puVar8]->l).cs.costs._end;
    lVar17 = (long)pwVar15 - (long)pwVar13 >> 4;
    lVar18 = lVar14;
    while (bVar19 = lVar17 != 0, lVar17 = lVar17 + -1, bVar19) {
      if (D->N < *(uint *)((long)&pwVar13->x + lVar18)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
        poVar9 = std::operator<<(&local_1a8,"error: edge source points to too large of a node id: ")
        ;
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9," > ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        pvVar10 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar10,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search_graph.cc"
                   ,0xe0,&local_218);
        __cxa_throw(pvVar10,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      lVar18 = lVar18 + 0x10;
    }
    for (uVar7 = 0; uVar7 < (ulong)((long)pwVar15 - (long)pwVar13 >> 4); uVar7 = uVar7 + 1) {
      uVar16 = (ulong)*(uint *)((long)&pwVar13->x + lVar14);
      if (uVar16 != 0) {
        pvVar3 = (D->adj).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar4 = *(pointer *)
                  ((long)&pvVar3[uVar16 - 1].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data + 8);
        if ((puVar4 == pvVar3[uVar16 - 1].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start) || ((pointer)puVar4[-1] != puVar8)) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (pvVar3 + (uVar16 - 1),(value_type_conflict1 *)&local_230);
          ppeVar11 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          puVar8 = local_230._M_impl.super__Vector_impl_data._M_start;
        }
      }
      pwVar13 = (ppeVar11[(long)puVar8]->l).cs.costs._begin;
      pwVar15 = (ppeVar11[(long)puVar8]->l).cs.costs._end;
      lVar14 = lVar14 + 0x10;
    }
    puVar8 = (pointer)((long)puVar8 + 1);
  } while( true );
}

Assistant:

void setup(Search::search& sch, multi_ex& ec)
{
  task_data& D = *sch.get_task_data<task_data>();
  D.multiplier = D.wpp << D.ss;
  D.wpp = sch.get_vw_pointer_unsafe().wpp;
  D.mask = sch.get_vw_pointer_unsafe().weights.mask();
  D.ss = sch.get_vw_pointer_unsafe().weights.stride_shift();
  D.N = 0;
  D.E = 0;
  for (size_t i = 0; i < ec.size(); i++)
    if (example_is_edge(ec[i]))
      D.E++;
    else  // it's a node!
    {
      if (D.E > 0)
        THROW("error: got a node after getting edges!");

      D.N++;
      if (ec[i]->l.cs.costs.size() > 0)
      {
        D.true_counts[ec[i]->l.cs.costs[0].class_index] += 1.;
        D.true_counts_total += 1.;
      }
    }

  if ((D.N == 0) && (D.E > 0))
    THROW("error: got edges without any nodes (perhaps ring_size is too small?)!");

  D.adj = vector<vector<size_t>>(D.N, vector<size_t>(0));

  for (size_t i = D.N; i < ec.size(); i++)
  {
    for (size_t n = 0; n < ec[i]->l.cs.costs.size(); n++)
    {
      if (ec[i]->l.cs.costs[n].class_index > D.N)
        THROW("error: edge source points to too large of a node id: " << (ec[i]->l.cs.costs[n].class_index) << " > "
                                                                      << D.N);
    }
    for (size_t n = 0; n < ec[i]->l.cs.costs.size(); n++)
    {
      size_t nn = ec[i]->l.cs.costs[n].class_index;
      if ((nn > 0) &&
          (((D.adj[nn - 1].size() == 0) || (D.adj[nn - 1][D.adj[nn - 1].size() - 1] != i))))  // don't allow dups
        D.adj[nn - 1].push_back(i);
    }
  }

  run_bfs(D, ec);

  D.pred.clear();
  for (size_t n = 0; n < D.N; n++) D.pred.push_back(D.K + 1);
}